

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::pipeContentStreams
          (QPDFObjectHandle *this,Pipeline *p,string *description,string *all_description)

{
  bool bVar1;
  uchar uVar2;
  reference pQVar3;
  QPDFExc *this_00;
  string local_1a8;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  QPDFObjGen local_160;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  LastChar lc;
  QPDFObjectHandle stream;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_80 [8];
  Pl_Buffer buf;
  undefined1 local_40 [7];
  bool need_newline;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  string *all_description_local;
  string *description_local;
  Pipeline *p_local;
  QPDFObjectHandle *this_local;
  
  streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)all_description;
  arrayOrStreamToStreamArray
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_40,this,
             description,all_description);
  buf.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
  _M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._7_1_ = 0;
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_80,"concatenated content stream buffer",(Pipeline *)0x0);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_40);
  stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&stream.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) {
      Pl_Buffer::getString_abi_cxx11_(&local_1a8,(Pl_Buffer *)local_80);
      Pipeline::writeString(p,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      (*p->_vptr_Pipeline[3])();
      Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_80);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_40);
      return;
    }
    pQVar3 = __gnu_cxx::
             __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    QPDFObjectHandle((QPDFObjectHandle *)&lc.last_char,pQVar3);
    if ((buf.m._M_t.
         super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
         super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._7_1_ & 1) != 0) {
      Pipeline::writeCStr((Pipeline *)local_80,"\n");
    }
    anon_unknown.dwarf_39d06e::LastChar::LastChar((LastChar *)local_f0,(Pipeline *)local_80);
    bVar1 = pipeStreamData((QPDFObjectHandle *)&lc.last_char,(Pipeline *)local_f0,0,
                           qpdf_dl_specialized,false,false);
    if (!bVar1) break;
    anon_unknown.dwarf_39d06e::LastChar::finish((LastChar *)local_f0);
    uVar2 = anon_unknown.dwarf_39d06e::LastChar::getLastChar((LastChar *)local_f0);
    buf.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
    _M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
    super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._7_1_ = uVar2 != '\n';
    QTC::TC("qpdf","QPDFObjectHandle need_newline",
            (byte)~buf.m._M_t.
                   super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                   .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._7_1_ & 1);
    anon_unknown.dwarf_39d06e::LastChar::~LastChar((LastChar *)local_f0);
    ~QPDFObjectHandle((QPDFObjectHandle *)&lc.last_char);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  QTC::TC("qpdf","QPDFObjectHandle errors in parsecontent",0);
  local_182 = 1;
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"content stream",&local_111);
  local_160 = getObjGen((QPDFObjectHandle *)&lc.last_char);
  QPDFObjGen::unparse_abi_cxx11_(&local_158,&local_160,' ');
  std::operator+(&local_138,"content stream object ",&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"errors while decoding content stream",&local_181);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_110,&local_138,0,&local_180);
  local_182 = 0;
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDFObjectHandle::pipeContentStreams(
    Pipeline* p, std::string const& description, std::string& all_description)
{
    std::vector<QPDFObjectHandle> streams =
        arrayOrStreamToStreamArray(description, all_description);
    bool need_newline = false;
    Pl_Buffer buf("concatenated content stream buffer");
    for (auto stream: streams) {
        if (need_newline) {
            buf.writeCStr("\n");
        }
        LastChar lc(buf);
        if (!stream.pipeStreamData(&lc, 0, qpdf_dl_specialized)) {
            QTC::TC("qpdf", "QPDFObjectHandle errors in parsecontent");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "content stream",
                "content stream object " + stream.getObjGen().unparse(' '),
                0,
                "errors while decoding content stream");
        }
        lc.finish();
        need_newline = (lc.getLastChar() != static_cast<unsigned char>('\n'));
        QTC::TC("qpdf", "QPDFObjectHandle need_newline", need_newline ? 0 : 1);
    }
    p->writeString(buf.getString());
    p->finish();
}